

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.cpp
# Opt level: O0

double Functions::getValue(double x,Activation func,bool derivative)

{
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  bool derivative_local;
  Activation func_local;
  double x_local;
  
  switch(func) {
  case SIGMOID:
    if (derivative) {
      local_30 = derivativeSigmoid(x);
    }
    else {
      local_30 = sigmoid(x);
    }
    x_local = local_30;
    break;
  case RELU:
    if (derivative) {
      local_38 = derivativeRelu(x);
    }
    else {
      local_38 = relu(x);
    }
    x_local = local_38;
    break;
  case IDENTITY:
    if (derivative) {
      local_40 = derivativeIdentity(x);
    }
    else {
      local_40 = identity(x);
    }
    x_local = local_40;
    break;
  case BINARY:
    if (derivative) {
      local_48 = derivativeBinary(x);
    }
    else {
      local_48 = binary(x);
    }
    x_local = local_48;
    break;
  case TANH:
    if (derivative) {
      local_50 = derivativeTanh(x);
    }
    else {
      local_50 = tanh(x);
    }
    x_local = local_50;
    break;
  default:
    if (derivative) {
      local_58 = derivativeSigmoid(x);
    }
    else {
      local_58 = sigmoid(x);
    }
    x_local = local_58;
  }
  return x_local;
}

Assistant:

double Functions::getValue(double x, Activation func, bool derivative) {
	switch (func) {
	case SIGMOID:
		return derivative ? derivativeSigmoid(x) : sigmoid(x);
	case RELU:
		return derivative ? derivativeRelu(x) : relu(x);
	case IDENTITY:
		return derivative ? derivativeIdentity(x) : identity(x);
	case BINARY:
		return derivative ? derivativeBinary(x) : binary(x);
	case TANH:
		return derivative ? derivativeTanh(x) : tanh(x);
	default:
		return derivative ? derivativeSigmoid(x) : sigmoid(x);
	}
}